

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

void __thiscall FuncInfo::Dump(FuncInfo *this)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  bool bVar5;
  FuncInfo *this_local;
  
  bVar5 = GetCallsEval(this);
  pcVar1 = L"LdFalse";
  if (bVar5) {
    pcVar1 = L"LdTrue";
  }
  bVar5 = GetChildCallsEval(this);
  pcVar2 = L"LdFalse";
  if (bVar5) {
    pcVar2 = L"LdTrue";
  }
  bVar5 = GetHasArguments(this);
  pcVar3 = L"LdFalse";
  if (bVar5) {
    pcVar3 = L"LdTrue";
  }
  bVar5 = GetHasHeapArguments(this);
  pcVar4 = L"LdFalse";
  if (bVar5) {
    pcVar4 = L"LdTrue";
  }
  Output::Print(L"FuncInfo: CallsEval:%s ChildCallsEval:%s HasArguments:%s HasHeapArguments:%s\n",
                pcVar1 + 2,pcVar2 + 2,pcVar3 + 2,pcVar4 + 2);
  return;
}

Assistant:

void FuncInfo::Dump()
{
    Output::Print(_u("FuncInfo: CallsEval:%s ChildCallsEval:%s HasArguments:%s HasHeapArguments:%s\n"),
        IsTrueOrFalse(this->GetCallsEval()),
        IsTrueOrFalse(this->GetChildCallsEval()),
        IsTrueOrFalse(this->GetHasArguments()),
        IsTrueOrFalse(this->GetHasHeapArguments()));
}